

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,big_decimal_fp *fp,
          basic_format_specs<char> *specs,float_specs fspecs,char decimal_point)

{
  int value;
  int iVar1;
  type tVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  undefined3 in_register_00000081;
  ulong uVar9;
  size_t size;
  bool bVar10;
  char local_cd;
  int num_zeros;
  sign_t sign;
  int significand_size;
  basic_format_specs<char> *local_c0;
  ulong local_b8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_b0;
  undefined4 local_a4;
  float_specs fspecs_local;
  char *significand;
  int local_90;
  int exp;
  ulong local_88;
  char *local_80;
  anon_class_40_7_ef14d3db write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  local_a4 = CONCAT31(in_register_00000081,decimal_point);
  significand = fp->significand;
  value = fp->significand_size;
  uVar9 = (ulong)fspecs >> 0x20;
  uVar8 = fspecs._4_4_;
  sign = uVar8 >> 8 & 0xff;
  bVar10 = sign != none;
  local_cd = decimal_point;
  significand_size = value;
  local_c0 = specs;
  local_b0.container = out.container;
  fspecs_local = fspecs;
  local_80 = significand;
  tVar2 = to_unsigned<int>(value);
  local_b8 = (ulong)(bVar10 + tVar2);
  iVar4 = fp->exponent;
  local_90 = value + iVar4 + -1;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_90;
  bVar10 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
           ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  iVar7 = fspecs.precision;
  if (bVar10) {
    iVar4 = iVar4 + value;
    local_88 = uVar9;
    if ((uVar8 >> 0x14 & 1) == 0) {
      iVar5 = 0;
      uVar9 = local_b8;
      cVar6 = (char)local_a4;
      if (value == 1) {
        cVar6 = '\0';
      }
    }
    else {
      iVar5 = 0;
      if (0 < iVar7 - value) {
        iVar5 = iVar7 - value;
      }
      tVar2 = to_unsigned<int>(iVar5);
      uVar9 = local_b8 + tVar2;
      cVar6 = (char)local_a4;
    }
    iVar1 = local_90;
    iVar7 = 1 - iVar4;
    if (0 < iVar4) {
      iVar7 = local_90;
    }
    iVar4 = 2;
    if (99 < iVar7) {
      iVar4 = (999 < iVar7) + 3;
    }
    tVar2 = to_unsigned<int>((3 - (uint)(cVar6 == '\0')) + iVar4);
    write._0_8_ = CONCAT44(write._4_4_,uVar8 >> 8) & 0xffffffff000000ff;
    write.significand = local_80;
    write.decimal_point = cVar6;
    write.significand_size = value;
    write._24_8_ = CONCAT35(write._29_3_,CONCAT14((((uint)local_88 >> 0x10 & 1) == 0) << 5,iVar5)) |
                   0x4500000000;
    write.output_exp = iVar1;
    if (0 < local_c0->width) {
      bVar3 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_&>
                        (local_b0,local_c0,uVar9 + tVar2,&write);
      return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar3.container;
    }
    bVar3 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
            ::anon_class_40_7_ef14d3db::operator()(&write,local_b0.container);
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar3.container;
  }
  iVar5 = fp->exponent;
  iVar4 = value + iVar5;
  exp = iVar4;
  if (iVar5 < 0) {
    if (0 < iVar4) {
      num_zeros = iVar7 - value & (int)(uVar8 << 0xb) >> 0x1f;
      uVar8 = num_zeros;
      if (num_zeros < 1) {
        uVar8 = 0;
      }
      tVar2 = to_unsigned<int>(uVar8);
      write._0_8_ = &sign;
      write.significand = (char *)&significand;
      write._16_8_ = &significand_size;
      write._24_8_ = &exp;
      write._32_8_ = &local_cd;
      bVar3 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_3_>
                        (local_b0,local_c0,(tVar2 + 1) + local_b8,(anon_class_48_6_48d028d1 *)&write
                        );
      return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar3.container;
    }
    iVar5 = -iVar4;
    num_zeros = iVar5;
    if (SBORROW4(iVar7,iVar5) != iVar7 + iVar4 < 0) {
      num_zeros = iVar7;
    }
    if (iVar7 < 0) {
      num_zeros = iVar5;
    }
    if (value != 0) {
      num_zeros = iVar5;
    }
    tVar2 = to_unsigned<int>(num_zeros);
    write._0_8_ = &sign;
    write._16_8_ = &significand_size;
    write._24_8_ = &fspecs_local;
    write._32_8_ = &local_cd;
    write.significand = (char *)&num_zeros;
    bVar3 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_4_>
                      (local_b0,local_c0,(tVar2 + 2) + local_b8,(anon_class_48_6_9afe1116 *)&write);
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar3.container;
  }
  tVar2 = to_unsigned<int>(iVar5);
  size = tVar2 + local_b8;
  num_zeros = fspecs_local.precision - iVar4;
  if (((uint)fspecs_local._4_4_ >> 0x14 & 1) != 0) {
    if (fspecs_local._4_1_ == '\x02' || 0 < num_zeros) {
      if (num_zeros < 1) goto LAB_0021c042;
    }
    else {
      num_zeros = 1;
    }
    tVar2 = to_unsigned<int>(num_zeros);
    size = size + tVar2;
  }
LAB_0021c042:
  write._0_8_ = &sign;
  write.significand = (char *)&significand;
  write._16_8_ = &significand_size;
  write._32_8_ = &fspecs_local;
  write._24_8_ = fp;
  bVar3 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_2_>
                    (local_b0,local_c0,size,(anon_class_56_7_a2a26a24 *)&write);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar3.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}